

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::MainBuilder::Impl::Arg>::setCapacity
          (Vector<kj::MainBuilder::Impl::Arg> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::MainBuilder::Impl::Arg> newBuilder;
  size_t newSize_local;
  Vector<kj::MainBuilder::Impl::Arg> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::MainBuilder::Impl::Arg>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::MainBuilder::Impl::Arg>
            ((ArrayBuilder<kj::MainBuilder::Impl::Arg> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>>(&this->builder);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::addAll<kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>>
            ((ArrayBuilder<kj::MainBuilder::Impl::Arg> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>>
                     ((ArrayBuilder<kj::MainBuilder::Impl::Arg> *)local_38);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::~ArrayBuilder
            ((ArrayBuilder<kj::MainBuilder::Impl::Arg> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }